

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vepu541_common.c
# Opt level: O1

MPP_RET vepu541_set_one_roi(void *buf,MppEncROIRegion *region,RK_S32 w,RK_S32 h)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  void *pvVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  
  if (buf == (void *)0x0 || region == (MppEncROIRegion *)0x0) {
    _mpp_log_l(2,"vepu541_common","invalid buf %p roi %p\n","vepu541_set_one_roi",buf,region);
  }
  else {
    iVar8 = w + 0xf >> 4;
    iVar5 = h + 0xf >> 4;
    uVar12 = (uint)(region->x >> 4);
    uVar7 = (uint)(region->y >> 4);
    iVar13 = (region->w + 0xf >> 4) + uVar12;
    iVar11 = (region->h + 0xf >> 4) + uVar7;
    if (iVar8 <= iVar13) {
      iVar13 = iVar8;
    }
    if (iVar5 <= iVar11) {
      iVar11 = iVar5;
    }
    if (region->x < 0x10) {
      uVar12 = 0;
    }
    if (region->y < 0x10) {
      uVar7 = 0;
    }
    if (iVar13 <= (int)uVar12) {
      _mpp_log_l(2,"vepu541_common","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "pos_x_end > pos_x_init","vepu541_set_one_roi",0x17a);
      if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00266e1f;
    }
    if (iVar11 <= (int)uVar7) {
      _mpp_log_l(2,"vepu541_common","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "pos_y_end > pos_y_init","vepu541_set_one_roi",0x17b);
      if ((mpp_debug._3_1_ & 0x10) != 0) {
LAB_00266e1f:
        abort();
      }
    }
    if ((int)uVar7 < iVar11) {
      uVar9 = iVar8 + 3U & 0xfffffffc;
      uVar2 = region->intra;
      uVar3 = region->qp_area_idx;
      uVar4 = region->quality;
      bVar1 = region->abs_qp_en;
      pvVar6 = (void *)((long)buf + (long)(int)(uVar7 * uVar9 + uVar12) * 2);
      iVar5 = 0;
      do {
        if (0 < (int)(iVar13 - uVar12)) {
          lVar10 = 0;
          do {
            *(ushort *)((long)pvVar6 + lVar10 * 2) =
                 (uVar4 & 0x7f) << 8 | (uVar3 & 0xf) << 4 | uVar2 & 1 | (ushort)bVar1 << 0xf | 0x80;
            lVar10 = lVar10 + 1;
          } while (iVar13 - uVar12 != (int)lVar10);
        }
        iVar5 = iVar5 + 1;
        pvVar6 = (void *)((long)pvVar6 + (long)(int)uVar9 * 2);
      } while (iVar5 != iVar11 - uVar7);
    }
  }
  return MPP_NOK;
}

Assistant:

MPP_RET vepu541_set_one_roi(void *buf, MppEncROIRegion *region, RK_S32 w, RK_S32 h)
{
    Vepu541RoiCfg *ptr = (Vepu541RoiCfg *)buf;
    RK_S32 mb_w = MPP_ALIGN(w, 16) / 16;
    RK_S32 mb_h = MPP_ALIGN(h, 16) / 16;
    RK_S32 stride_h = MPP_ALIGN(mb_w, 4);
    Vepu541RoiCfg cfg;
    MPP_RET ret = MPP_NOK;

    if (NULL == buf || NULL == region) {
        mpp_err_f("invalid buf %p roi %p\n", buf, region);
        goto DONE;
    }

    RK_S32 roi_width  = (region->w + 15) / 16;
    RK_S32 roi_height = (region->h + 15) / 16;
    RK_S32 pos_x_init = region->x / 16;
    RK_S32 pos_y_init = region->y / 16;
    RK_S32 pos_x_end  = pos_x_init + roi_width;
    RK_S32 pos_y_end  = pos_y_init + roi_height;
    RK_S32 x, y;

    pos_x_end = MPP_MIN(pos_x_end, mb_w);
    pos_y_end = MPP_MIN(pos_y_end, mb_h);
    pos_x_init = MPP_MAX(pos_x_init, 0);
    pos_y_init = MPP_MAX(pos_y_init, 0);

    mpp_assert(pos_x_end > pos_x_init);
    mpp_assert(pos_y_end > pos_y_init);

    cfg.force_intra = region->intra;
    cfg.reserved    = 0;
    cfg.qp_area_idx = region->qp_area_idx;
    // NOTE: When roi is enabled the qp_area_en should be one.
    cfg.qp_area_en  = 1;    // region->area_map_en;
    cfg.qp_adj      = region->quality;
    cfg.qp_adj_mode = region->abs_qp_en;

    ptr += pos_y_init * stride_h + pos_x_init;
    roi_width = pos_x_end - pos_x_init;
    roi_height = pos_y_end - pos_y_init;

    for (y = 0; y < roi_height; y++) {
        Vepu541RoiCfg *dst = ptr;

        for (x = 0; x < roi_width; x++, dst++)
            memcpy(dst, &cfg, sizeof(cfg));

        ptr += stride_h;
    }
DONE:
    return ret;
}